

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O0

void __thiscall
HDWallet_ConvertEntropyToMnemonicErrorTest_Test::TestBody
          (HDWallet_ConvertEntropyToMnemonicErrorTest_Test *this)

{
  bool bVar1;
  const_reference pvVar2;
  AssertionResult gtest_ar_1;
  CfdException *e_1;
  AssertionResult gtest_ar__1;
  Message local_228 [2];
  CfdException *anon_var_0_2;
  string local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  byte local_1d1;
  char *pcStack_1d0;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  ByteData entropy;
  AssertionResult gtest_ar;
  CfdException *e;
  AssertionResult gtest_ar_;
  Message local_138 [2];
  CfdException *anon_var_0_1;
  byte local_109;
  char *pcStack_108;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  string local_f8;
  undefined1 local_d8 [8];
  ByteData invalid_length_entropy;
  Message local_b8 [2];
  CfdException *anon_var_0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  byte local_81;
  char *pcStack_80;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  ByteData empty_entropy;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  actual_mnemonic;
  HDWallet_ConvertEntropyToMnemonicErrorTest_Test *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&empty_entropy.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"",&local_61);
  cfd::core::ByteData::ByteData((ByteData *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff80,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff80);
  if (bVar1) {
    local_81 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::ConvertEntropyToMnemonic
                (&local_a0,(ByteData *)local_40,&language_abi_cxx11_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&empty_entropy.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a0);
    }
    if ((local_81 & 1) == 0) {
      pcStack_80 = 
      "Expected: actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(empty_entropy, language) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0027c408;
    }
  }
  else {
LAB_0027c408:
    testing::Message::Message(local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &invalid_length_entropy.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0xeb,pcStack_80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &invalid_length_entropy.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &invalid_length_entropy.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_b8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f8,"000000000000000000000000000000",
             (allocator *)((long)&gtest_msg_1.value + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_d8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffef8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffef8);
  if (bVar1) {
    local_109 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::HDWallet::ConvertEntropyToMnemonic
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&anon_var_0_1,(ByteData *)local_d8,&language_abi_cxx11_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&empty_entropy.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&anon_var_0_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&anon_var_0_1);
    }
    if ((local_109 & 1) == 0) {
      pcStack_108 = 
      "Expected: actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(invalid_length_entropy, language) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0027c65f;
    }
  }
  else {
LAB_0027c65f:
    testing::Message::Message(local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
               ,0xef,pcStack_108);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_138);
  }
  cfd::core::ByteData::~ByteData((ByteData *)local_d8);
  cfd::core::ByteData::~ByteData((ByteData *)local_40);
  pvVar2 = std::vector<Bip39TestVector,_std::allocator<Bip39TestVector>_>::operator[]
                     (&bip39_test_vectors,0);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_msg_2,&pvVar2->entropy);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe30,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe30);
  if (bVar1) {
    local_1d1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,"zz",(allocator *)((long)&anon_var_0_2 + 7))
      ;
      cfd::core::HDWallet::ConvertEntropyToMnemonic(&local_1f0,(ByteData *)&gtest_msg_2,&local_210);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&empty_entropy.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_1f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_2 + 7));
    }
    if ((local_1d1 & 1) != 0) goto LAB_0027ccac;
    pcStack_1d0 = 
    "Expected: actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(entropy, \"zz\") throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_228);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
             ,0xf9,pcStack_1d0);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,local_228);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
  testing::Message::~Message(local_228);
LAB_0027ccac:
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_msg_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&empty_entropy.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(HDWallet, ConvertEntropyToMnemonicErrorTest) {
  std::vector<std::string> actual_mnemonic;
  try {
    ByteData empty_entropy("");
    // check empty mnemonic
    EXPECT_THROW(actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(empty_entropy, language), CfdException);

    // check invalid mnemonic
    ByteData invalid_length_entropy("000000000000000000000000000000");
    EXPECT_THROW(actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(invalid_length_entropy, language), CfdException);
  } catch (CfdException &e) {
    EXPECT_STREQ(e.what(), "Convert entropy to mnemonic error.");
  } catch (...) {
    // force to fail test
    EXPECT_TRUE(false);
  }

  try {
    ByteData entropy = bip39_test_vectors[0].entropy;
    EXPECT_THROW(actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(entropy, "zz"), CfdException);
  } catch (CfdException &e) {
    EXPECT_STREQ(e.what(), "Not support language passed.");
  } catch (...) {
    // force to fail test
    EXPECT_TRUE(false);
  }
}